

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::TryLowerNewScObjectWithFixedCtorCache
          (Lowerer *this,Instr *newObjInstr,RegOpnd *newObjDst,LabelInstr *helperOrBailoutLabel,
          LabelInstr *callCtorLabel,bool *skipNewScObj,bool *returnNewScObj,bool *emitBailOut)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  int16 iVar4;
  PropertyIndex PVar5;
  uint uVar6;
  uint uVar7;
  BailOutKind BVar8;
  ProfiledInstr *pPVar9;
  JITTimeFunctionBody *this_00;
  char16 *pcVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  undefined4 *puVar13;
  size_t sVar14;
  intptr_t iVar15;
  MemRefOpnd *compareSrc1;
  AddrOpnd *pAVar16;
  Opnd *src;
  JITType *pJVar17;
  JITTypeHandler *this_01;
  BranchInstr *instr;
  char16_t *pcVar18;
  JITTimeConstructorCache *local_120;
  BranchInstr *callCtorBranch;
  int slotSize;
  int inlineSlotSize;
  AddrOpnd *typeSrc;
  JITTypeHolder newObjectType;
  FixedFieldInfo *ctor;
  AddrOpnd *zeroOpnd;
  MemRefOpnd *guardOpnd;
  JITTypeHolderBase<void> local_b8;
  AddrOpnd *local_b0;
  AddrOpnd *zeroOpnd_1;
  char16 debugStringBuffer [42];
  JITTimeConstructorCache *local_48;
  JITTimeConstructorCache *ctorCache;
  bool *skipNewScObj_local;
  LabelInstr *callCtorLabel_local;
  LabelInstr *helperOrBailoutLabel_local;
  RegOpnd *newObjDst_local;
  Instr *newObjInstr_local;
  Lowerer *this_local;
  
  *skipNewScObj = false;
  *returnNewScObj = false;
  uVar6 = Func::GetSourceContextId(newObjInstr->m_func);
  uVar7 = Func::GetLocalFunctionId(newObjInstr->m_func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FixedNewObjPhase,uVar6,uVar7);
  if (bVar3) {
    uVar6 = Func::GetSourceContextId(this->m_func);
    uVar7 = Func::GetLocalFunctionId(this->m_func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ObjTypeSpecNewObjPhase,uVar6,uVar7);
    if (bVar3) {
      return false;
    }
  }
  bVar3 = IR::Instr::HasBailOutInfo(newObjInstr);
  if ((bVar3) &&
     (BVar8 = IR::Instr::GetBailOutKindNoBits(newObjInstr), BVar8 == BailOutFailedCtorGuardCheck)) {
    bVar3 = IR::Instr::IsNewScObjectInstr(newObjInstr);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x12eb,"(newObjInstr->IsNewScObjectInstr())",
                         "newObjInstr->IsNewScObjectInstr()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    bVar3 = IR::Instr::IsProfiledInstr(newObjInstr);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x12ec,"(newObjInstr->IsProfiledInstr())","newObjInstr->IsProfiledInstr()"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    BVar8 = IR::Instr::GetBailOutKind(newObjInstr);
    if (BVar8 != BailOutFailedCtorGuardCheck) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x12ed,
                         "(newObjInstr->GetBailOutKind() == IR::BailOutFailedCtorGuardCheck)",
                         "newObjInstr->GetBailOutKind() == IR::BailOutFailedCtorGuardCheck");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    *emitBailOut = true;
    pFVar1 = newObjInstr->m_func;
    pPVar9 = IR::Instr::AsProfiledInstr(newObjInstr);
    local_48 = Func::GetConstructorCache(pFVar1,(pPVar9->u).field_3.fldInfoData.f1);
    if (local_48 == (JITTimeConstructorCache *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x12f2,"(ctorCache != nullptr)","ctorCache != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    bVar3 = JITTimeConstructorCache::SkipNewScObject(local_48);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x12f3,"(!ctorCache->SkipNewScObject())","!ctorCache->SkipNewScObject()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    bVar3 = JITTimeConstructorCache::IsTypeFinal(local_48);
    if ((bVar3) && (bVar3 = JITTimeConstructorCache::CtorHasNoExplicitReturnValue(local_48), !bVar3)
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x12f4,
                         "(!ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue())",
                         "!ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    LinkCtorCacheToGuardedProperties(this,local_48);
  }
  else {
    if ((newObjInstr->m_opcode == NewScObjArray) || (newObjInstr->m_opcode == NewScObjArraySpread))
    {
      return false;
    }
    bVar3 = IR::Instr::IsProfiledInstr(newObjInstr);
    if (bVar3) {
      pFVar1 = newObjInstr->m_func;
      pPVar9 = IR::Instr::AsProfiledInstr(newObjInstr);
      local_120 = Func::GetConstructorCache(pFVar1,(pPVar9->u).field_3.fldInfoData.f1);
    }
    else {
      local_120 = (JITTimeConstructorCache *)0x0;
    }
    local_48 = local_120;
    if (local_120 == (JITTimeConstructorCache *)0x0) {
      uVar6 = Func::GetSourceContextId(newObjInstr->m_func);
      uVar7 = Func::GetLocalFunctionId(newObjInstr->m_func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,FixedNewObjPhase,uVar6,uVar7);
      if (!bVar3) {
        uVar6 = Func::GetSourceContextId(newObjInstr->m_func);
        uVar7 = Func::GetLocalFunctionId(newObjInstr->m_func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,FixedNewObjPhase,uVar6,uVar7);
        if (!bVar3) {
          return false;
        }
      }
      this_00 = Func::GetJITFunctionBody(newObjInstr->m_func);
      pcVar10 = JITTimeFunctionBody::GetDisplayName(this_00);
      pcVar11 = Func::GetDebugNumberSet(newObjInstr->m_func,(wchar (*) [42])&zeroOpnd_1);
      pcVar12 = Js::OpCodeUtil::GetOpCodeName(newObjInstr->m_opcode);
      bVar3 = IR::Instr::IsProfiledInstr(newObjInstr);
      pcVar18 = L"instruction is not profiled";
      if (bVar3) {
        pcVar18 = L"constructor cache hasn\'t been cloned";
      }
      Output::Print(L"FixedNewObj: function %s (%s): lowering non-fixed new script object for %s, because %s.\n"
                    ,pcVar10,pcVar11,pcVar12,pcVar18);
      Output::Flush();
      return false;
    }
  }
  if (local_48 == (JITTimeConstructorCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1311,"(ctorCache != nullptr)","ctorCache != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  bVar3 = JITTimeConstructorCache::SkipNewScObject(local_48);
  if (bVar3) {
    if ((*emitBailOut & 1U) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1330,"(!emitBailOut)",
                         "Can\'t bail out on constructor cache guard for built-in constructors.");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    *skipNewScObj = true;
    local_b0 = IR::AddrOpnd::NewNull(this->m_func);
    InsertMove(&newObjDst->super_Opnd,&local_b0->super_Opnd,newObjInstr,true);
    return true;
  }
  local_b8.t = (Type)JITTimeConstructorCache::GetType(local_48);
  guardOpnd = (MemRefOpnd *)0x0;
  bVar3 = JITTypeHolderBase<void>::operator!=(&local_b8,&guardOpnd);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1338,"(ctorCache->GetType() != nullptr)",
                       "Why did we hard-code a mismatched, invalidated or polymorphic constructor cache?"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  bVar3 = JITTimeConstructorCache::CtorHasNoExplicitReturnValue(local_48);
  *returnNewScObj = bVar3;
  sVar14 = Js::ConstructorCache::GetSizeOfGuardValue();
  if (sVar14 != 8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x135b,
                       "(Js::ConstructorCache::GetSizeOfGuardValue() == static_cast<size_t>(TySize[TyMachPtr]))"
                       ,
                       "Js::ConstructorCache::GetSizeOfGuardValue() == static_cast<size_t>(TySize[TyMachPtr])"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  iVar15 = JITTimeConstructorCache::GetRuntimeCacheGuardAddr(local_48);
  compareSrc1 = IR::MemRefOpnd::New(iVar15,TyInt64,this->m_func,AddrOpndKindDynamicGuardValueRef);
  pAVar16 = IR::AddrOpnd::NewNull(this->m_func);
  InsertCompareBranch(this,&compareSrc1->super_Opnd,&pAVar16->super_Opnd,BrEq_A,helperOrBailoutLabel
                      ,newObjInstr,false);
  newObjectType.t = (Type)IR::Instr::GetFixedFunction(newObjInstr);
  bVar3 = FixedFieldInfo::IsClassCtor((FixedFieldInfo *)newObjectType.t);
  if (bVar3) {
    src = IR::Instr::GetSrc1(newObjInstr);
    InsertMove(&newObjDst->super_Opnd,src,newObjInstr,true);
  }
  else {
    typeSrc = (AddrOpnd *)JITTimeConstructorCache::GetType(local_48);
    pJVar17 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&typeSrc);
    bVar3 = JITType::IsShared(pJVar17);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x136d,"(newObjectType->IsShared())","newObjectType->IsShared()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    pJVar17 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&typeSrc);
    iVar15 = JITType::GetAddr(pJVar17);
    pAVar16 = IR::AddrOpnd::New(iVar15,AddrOpndKindDynamicType,this->m_func,false,(Var)0x0);
    iVar4 = JITTimeConstructorCache::GetInlineSlotCount(local_48);
    callCtorBranch._4_4_ = (uint)iVar4;
    callCtorBranch._0_4_ = JITTimeConstructorCache::GetSlotCount(local_48);
    pJVar17 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&typeSrc);
    this_01 = JITType::GetTypeHandler(pJVar17);
    bVar3 = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(this_01);
    if (bVar3) {
      PVar5 = Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      if ((int)callCtorBranch._4_4_ < (int)(uint)PVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1378,
                           "(inlineSlotSize >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity())"
                           ,
                           "inlineSlotSize >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      if (callCtorBranch._4_4_ != (uint)callCtorBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1379,"(inlineSlotSize == slotSize)","inlineSlotSize == slotSize");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      PVar5 = Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      callCtorBranch._0_4_ = callCtorBranch._4_4_ - PVar5;
      callCtorBranch._4_4_ = (uint)callCtorBranch;
    }
    GenerateDynamicObjectAlloc
              (this,newObjInstr,callCtorBranch._4_4_,(uint)callCtorBranch,newObjDst,
               &pAVar16->super_Opnd);
  }
  instr = IR::BranchInstr::New(JMP,callCtorLabel,this->m_func);
  IR::Instr::InsertBefore(newObjInstr,&instr->super_Instr);
  return true;
}

Assistant:

bool Lowerer::TryLowerNewScObjectWithFixedCtorCache(IR::Instr* newObjInstr, IR::RegOpnd* newObjDst,
    IR::LabelInstr* helperOrBailoutLabel, IR::LabelInstr* callCtorLabel, bool& skipNewScObj, bool& returnNewScObj, bool& emitBailOut)
{
    skipNewScObj = false;
    returnNewScObj = false;

    if (PHASE_OFF(Js::FixedNewObjPhase, newObjInstr->m_func) && PHASE_OFF(Js::ObjTypeSpecNewObjPhase, this->m_func))
    {
        return false;
    }

    JITTimeConstructorCache * ctorCache;

    if (newObjInstr->HasBailOutInfo() && newObjInstr->GetBailOutKindNoBits() == IR::BailOutFailedCtorGuardCheck)
    {
        Assert(newObjInstr->IsNewScObjectInstr());
        Assert(newObjInstr->IsProfiledInstr());
        Assert(newObjInstr->GetBailOutKind() == IR::BailOutFailedCtorGuardCheck);

        emitBailOut = true;

        ctorCache = newObjInstr->m_func->GetConstructorCache(static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId));
        Assert(ctorCache != nullptr);
        Assert(!ctorCache->SkipNewScObject());
        Assert(!ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue());

        LinkCtorCacheToGuardedProperties(ctorCache);
    }
    else
    {
        if (newObjInstr->m_opcode == Js::OpCode::NewScObjArray || newObjInstr->m_opcode == Js::OpCode::NewScObjArraySpread)
        {
            // These instr's carry a profile that indexes the array call site info, not the ctor cache.
            return false;
        }

        ctorCache = newObjInstr->IsProfiledInstr() ? newObjInstr->m_func->GetConstructorCache(static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId)) : nullptr;

        if (ctorCache == nullptr)
        {
            if (PHASE_TRACE(Js::FixedNewObjPhase, newObjInstr->m_func) || PHASE_TESTTRACE(Js::FixedNewObjPhase, newObjInstr->m_func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("FixedNewObj: function %s (%s): lowering non-fixed new script object for %s, because %s.\n"),
                    newObjInstr->m_func->GetJITFunctionBody()->GetDisplayName(), newObjInstr->m_func->GetDebugNumberSet(debugStringBuffer), Js::OpCodeUtil::GetOpCodeName(newObjInstr->m_opcode),
                    newObjInstr->IsProfiledInstr() ? _u("constructor cache hasn't been cloned") : _u("instruction is not profiled"));
                Output::Flush();
            }

            return false;
        }
    }

    Assert(ctorCache != nullptr);

    // We should only have cloned if the script contexts match.
    // TODO: oop jit, add ctorCache->scriptContext for tracing assert
    // Assert(newObjInstr->m_func->GetScriptContextInfo()->GetAddr() == ctorCache->scriptContext);

    // Built-in constructors don't need a default new object.  Since we know which constructor we're calling, we can skip creating a default
    // object and call a specialized helper (or even constructor, directly) avoiding the checks in generic NewScObjectCommon.
    if (ctorCache->SkipNewScObject())
    {
#if 0 // TODO: oop jit, add constructor info for tracing
        if (PHASE_TRACE(Js::FixedNewObjPhase, newObjInstr->m_func) || PHASE_TESTTRACE(Js::FixedNewObjPhase, newObjInstr->m_func))
        {
            const Js::JavascriptFunction* ctor = ctorCache->constructor;
            Js::FunctionBody* ctorBody = ctor->GetFunctionInfo()->HasBody() ? ctor->GetFunctionInfo()->GetFunctionBody() : nullptr;
            const char16* ctorName = ctorBody != nullptr ? ctorBody->GetDisplayName() : _u("<unknown>");

            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

            Output::Print(_u("FixedNewObj: function %s (%s): lowering skipped new script object for %s with %s ctor <unknown> (%s %s).\n"),
                newObjInstr->m_func->GetJITFunctionBody()->GetDisplayName(), newObjInstr->m_func->GetDebugNumberSet(debugStringBuffer2), Js::OpCodeUtil::GetOpCodeName(newObjInstr->m_opcode),
                newObjInstr->m_opcode == Js::OpCode::NewScObjectNoCtor ? _u("inlined") : _u("called"),
                ctorName, ctorBody ? ctorBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"));
            Output::Flush();
        }
#endif

        // All built-in constructors share a special singleton cache that is never checked and never invalidated.  It cannot be used
        // as a guard to protect any property operations downstream from the constructor.  If this ever becomes a performance issue,
        // we could have a dedicated cache for each built-in constructor, populate it and invalidate it as any other constructor cache.
        AssertMsg(!emitBailOut, "Can't bail out on constructor cache guard for built-in constructors.");

        skipNewScObj = true;
        IR::AddrOpnd* zeroOpnd = IR::AddrOpnd::NewNull(this->m_func);
        this->InsertMove(newObjDst, zeroOpnd, newObjInstr);
        return true;
    }

    AssertMsg(ctorCache->GetType() != nullptr, "Why did we hard-code a mismatched, invalidated or polymorphic constructor cache?");

#if 0 // TODO: oop jit, add constructor info for tracing
    if (PHASE_TRACE(Js::FixedNewObjPhase, newObjInstr->m_func) || PHASE_TESTTRACE(Js::FixedNewObjPhase, newObjInstr->m_func))
    {
        const Js::JavascriptFunction* constructor = ctorCache->constructor;
        Js::FunctionBody* constructorBody = constructor->GetFunctionInfo()->HasBody() ? constructor->GetFunctionInfo()->GetFunctionBody() : nullptr;
        const char16* constructorName = constructorBody != nullptr ? constructorBody->GetDisplayName() : _u("<unknown>");

        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

        if (PHASE_TRACE(Js::FixedNewObjPhase, newObjInstr->m_func))
        {
            Output::Print(_u("FixedNewObj: function %s (%s): lowering fixed new script object for %s with %s ctor <unknown> (%s %s): type = %p, slots = %d, inlined slots = %d.\n"),
                newObjInstr->m_func->GetJITFunctionBody()->GetDisplayName(), newObjInstr->m_func->GetDebugNumberSet(debugStringBuffer2), Js::OpCodeUtil::GetOpCodeName(newObjInstr->m_opcode),
                newObjInstr->m_opcode == Js::OpCode::NewScObjectNoCtor ? _u("inlined") : _u("called"),
                constructorName, constructorBody ? constructorBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"),
                ctorCache->type, ctorCache->slotCount, ctorCache->inlineSlotCount);
        }
        else
        {
            Output::Print(_u("FixedNewObj: function %s (%s): lowering fixed new script object for %s with %s ctor <unknown> (%s %s): slots = %d, inlined slots = %d.\n"),
                newObjInstr->m_func->GetJITFunctionBody()->GetDisplayName(), newObjInstr->m_func->GetDebugNumberSet(debugStringBuffer2), Js::OpCodeUtil::GetOpCodeName(newObjInstr->m_opcode),
                newObjInstr->m_opcode == Js::OpCode::NewScObjectNoCtor ? _u("inlined") : _u("called"),
                constructorName, debugStringBuffer, ctorCache->slotCount, ctorCache->inlineSlotCount);
        }
        Output::Flush();
    }
#endif

    // If the constructor has no return statements, we can safely return the object that was created here.
    // No need to check what the constructor returned - it must be undefined.
    returnNewScObj = ctorCache->CtorHasNoExplicitReturnValue();

    Assert(Js::ConstructorCache::GetSizeOfGuardValue() == static_cast<size_t>(TySize[TyMachPtr]));
    IR::MemRefOpnd* guardOpnd = IR::MemRefOpnd::New(ctorCache->GetRuntimeCacheGuardAddr(), TyMachReg, this->m_func,
        IR::AddrOpndKindDynamicGuardValueRef);
    IR::AddrOpnd* zeroOpnd = IR::AddrOpnd::NewNull(this->m_func);
    InsertCompareBranch(guardOpnd, zeroOpnd, Js::OpCode::BrEq_A, helperOrBailoutLabel, newObjInstr);

    // If we are calling new on a class constructor, the contract is that we pass new.target as the 'this' argument.
    // function is the constructor on which we called new - which is new.target.
    FixedFieldInfo* ctor = newObjInstr->GetFixedFunction();

    if (ctor->IsClassCtor())
    {
        // MOV newObjDst, function
        this->InsertMove(newObjDst, newObjInstr->GetSrc1(), newObjInstr);
    }
    else
    {
        JITTypeHolder newObjectType(ctorCache->GetType());
        Assert(newObjectType->IsShared());

        IR::AddrOpnd* typeSrc = IR::AddrOpnd::New(newObjectType->GetAddr(), IR::AddrOpndKindDynamicType, m_func);

        // For the next call:
        //     inlineSlotSize == Number of slots to allocate beyond the DynamicObject header
        //     slotSize - inlineSlotSize == Number of aux slots to allocate
        int inlineSlotSize = ctorCache->GetInlineSlotCount();
        int slotSize = ctorCache->GetSlotCount();
        if (newObjectType->GetTypeHandler()->IsObjectHeaderInlinedTypeHandler())
        {
            Assert(inlineSlotSize >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity());
            Assert(inlineSlotSize == slotSize);
            slotSize = inlineSlotSize -= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
        }
        GenerateDynamicObjectAlloc(newObjInstr, inlineSlotSize, slotSize, newObjDst, typeSrc);
    }

    // JMP $callCtor
    IR::BranchInstr *callCtorBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, callCtorLabel, m_func);
    newObjInstr->InsertBefore(callCtorBranch);

    return true;
}